

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pnm_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc sVar1;
  int iVar2;
  undefined8 in_RAX;
  stbi_uc *psVar3;
  stbi_uc *psVar4;
  long in_FS_OFFSET;
  bool bVar5;
  undefined8 uStack_38;
  char c;
  
  psVar3 = s->img_buffer_original;
  psVar4 = s->img_buffer_original_end;
  s->img_buffer = psVar3;
  s->img_buffer_end = psVar4;
  uStack_38 = in_RAX;
  if (psVar3 < psVar4) {
LAB_0011b46c:
    s->img_buffer = psVar3 + 1;
    bVar5 = *psVar3 != 'P';
    psVar3 = psVar3 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar3 = s->img_buffer;
      psVar4 = s->img_buffer_end;
      goto LAB_0011b46c;
    }
    bVar5 = true;
  }
  if (psVar4 <= psVar3) {
    if (s->read_from_callbacks == 0) goto LAB_0011b4b9;
    stbi__refill_buffer(s);
    psVar3 = s->img_buffer;
  }
  psVar4 = psVar3 + 1;
  s->img_buffer = psVar4;
  if (!(bool)(~bVar5 & 0xfd < (byte)(*psVar3 - 0x37))) {
LAB_0011b4b9:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    return 0;
  }
  if (comp != (int *)0x0) {
    *comp = (uint)(*psVar3 == '6') * 2 + 1;
  }
  if (s->img_buffer_end <= psVar4) {
    if (s->read_from_callbacks == 0) {
      sVar1 = '\0';
      goto LAB_0011b512;
    }
    stbi__refill_buffer(s);
    psVar4 = s->img_buffer;
  }
  s->img_buffer = psVar4 + 1;
  sVar1 = *psVar4;
LAB_0011b512:
  uStack_38 = CONCAT17(sVar1,(undefined7)uStack_38);
  stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
  iVar2 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
  if (x != (int *)0x0) {
    *x = iVar2;
  }
  stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
  iVar2 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
  if (y != (int *)0x0) {
    *y = iVar2;
  }
  stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
  iVar2 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
  if (0xff < iVar2) {
    *(char **)(in_FS_OFFSET + -0x10) = "max value > 255";
    return 0;
  }
  return 1;
}

Assistant:

static int      stbi__pnm_info(stbi__context *s, int *x, int *y, int *comp)
{
   int maxv, dummy;
   char c, p, t;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   stbi__rewind(s);

   // Get identifier
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind(s);
       return 0;
   }

   *comp = (t == '6') ? 3 : 1;  // '5' is 1-component .pgm; '6' is 3-component .ppm

   c = (char) stbi__get8(s);
   stbi__pnm_skip_whitespace(s, &c);

   *x = stbi__pnm_getinteger(s, &c); // read width
   stbi__pnm_skip_whitespace(s, &c);

   *y = stbi__pnm_getinteger(s, &c); // read height
   stbi__pnm_skip_whitespace(s, &c);

   maxv = stbi__pnm_getinteger(s, &c);  // read max value

   if (maxv > 255)
      return stbi__err("max value > 255", "PPM image not 8-bit");
   else
      return 1;
}